

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

void __thiscall ir_constant::copy_offset(ir_constant *this,ir_constant *src,int offset)

{
  byte bVar1;
  glsl_type *pgVar2;
  glsl_type *pgVar3;
  bool bVar4;
  uint16_t uVar5;
  uint uVar6;
  int iVar7;
  uint64_t uVar8;
  undefined4 extraout_var;
  uint uVar9;
  uint i;
  ulong uVar10;
  float fVar11;
  double dVar12;
  
  pgVar2 = (this->super_ir_rvalue).type;
  bVar1 = pgVar2->field_0x4;
  if (bVar1 < 0x12) {
    if ((0x3e1fU >> (bVar1 & 0x1f) & 1) == 0) {
      if ((0x28000U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_00162b10;
      if ((src->super_ir_rvalue).type != pgVar2) {
        __assert_fail("src->type == this->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                      ,0x4f7,"void ir_constant::copy_offset(ir_constant *, int)");
      }
      if (pgVar2->length != 0) {
        uVar10 = 0;
        do {
          iVar7 = (*(src->const_elements[uVar10]->super_ir_rvalue).super_ir_instruction.
                    _vptr_ir_instruction[4])(src->const_elements[uVar10],this,0);
          this->const_elements[uVar10] = (ir_constant *)CONCAT44(extraout_var,iVar7);
          uVar10 = uVar10 + 1;
        } while (uVar10 < ((this->super_ir_rvalue).type)->length);
      }
    }
    else {
      pgVar3 = (src->super_ir_rvalue).type;
      uVar9 = (uint)pgVar3->matrix_columns * (uint)pgVar3->vector_elements;
      if ((uint)pgVar2->matrix_columns * (uint)pgVar2->vector_elements - offset < uVar9) {
        __assert_fail("size <= this->type->components() - offset",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                      ,0x4d1,"void ir_constant::copy_offset(ir_constant *, int)");
      }
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          i = (uint)uVar10;
          switch(((this->super_ir_rvalue).type)->field_0x4) {
          case 0:
            uVar6 = get_uint_component(src,i);
            goto LAB_00162a08;
          case 1:
            uVar6 = get_int_component(src,i);
LAB_00162a08:
            *(uint *)((long)&this->value + (ulong)(i + offset) * 4) = uVar6;
            break;
          case 2:
            fVar11 = get_float_component(src,i);
            *(float *)((long)&this->value + (ulong)(i + offset) * 4) = fVar11;
            break;
          case 3:
            uVar5 = get_float16_component(src,i);
            *(uint16_t *)((long)&this->value + (ulong)(i + offset) * 2) = uVar5;
            break;
          case 4:
            dVar12 = get_double_component(src,i);
            *(double *)((long)&this->value + (ulong)(i + offset) * 8) = dVar12;
            break;
          case 9:
          case 0xc:
          case 0xd:
            uVar8 = get_uint64_component(src,i);
            goto LAB_00162a63;
          case 10:
            uVar8 = get_int64_component(src,i);
LAB_00162a63:
            *(uint64_t *)((long)&this->value + (ulong)(i + offset) * 8) = uVar8;
            break;
          case 0xb:
            bVar4 = get_bool_component(src,i);
            (this->value).b[i + offset] = bVar4;
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
    return;
  }
LAB_00162b10:
  __assert_fail("!\"Should not get here.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                ,0x4ff,"void ir_constant::copy_offset(ir_constant *, int)");
}

Assistant:

void
ir_constant::copy_offset(ir_constant *src, int offset)
{
   switch (this->type->base_type) {
   case GLSL_TYPE_UINT:
   case GLSL_TYPE_INT:
   case GLSL_TYPE_FLOAT:
   case GLSL_TYPE_FLOAT16:
   case GLSL_TYPE_DOUBLE:
   case GLSL_TYPE_SAMPLER:
   case GLSL_TYPE_IMAGE:
   case GLSL_TYPE_UINT64:
   case GLSL_TYPE_INT64:
   case GLSL_TYPE_BOOL: {
      unsigned int size = src->type->components();
      assert (size <= this->type->components() - offset);
      for (unsigned int i=0; i<size; i++) {
	 switch (this->type->base_type) {
	 case GLSL_TYPE_UINT:
	    value.u[i+offset] = src->get_uint_component(i);
	    break;
	 case GLSL_TYPE_INT:
	    value.i[i+offset] = src->get_int_component(i);
	    break;
	 case GLSL_TYPE_FLOAT:
	    value.f[i+offset] = src->get_float_component(i);
	    break;
	 case GLSL_TYPE_FLOAT16:
	    value.f16[i+offset] = src->get_float16_component(i);
	    break;
	 case GLSL_TYPE_BOOL:
	    value.b[i+offset] = src->get_bool_component(i);
	    break;
	 case GLSL_TYPE_DOUBLE:
	    value.d[i+offset] = src->get_double_component(i);
	    break;
	 case GLSL_TYPE_SAMPLER:
	 case GLSL_TYPE_IMAGE:
	 case GLSL_TYPE_UINT64:
	    value.u64[i+offset] = src->get_uint64_component(i);
	    break;
	 case GLSL_TYPE_INT64:
	    value.i64[i+offset] = src->get_int64_component(i);
	    break;
	 default: // Shut up the compiler
	    break;
	 }
      }
      break;
   }

   case GLSL_TYPE_STRUCT:
   case GLSL_TYPE_ARRAY: {
      assert (src->type == this->type);
      for (unsigned i = 0; i < this->type->length; i++) {
	 this->const_elements[i] = src->const_elements[i]->clone(this, NULL);
      }
      break;
   }

   default:
      assert(!"Should not get here.");
      break;
   }
}